

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

bool __thiscall RenX_RelayPlugin::initialize(RenX_RelayPlugin *this)

{
  bool bVar1;
  rep rVar2;
  reference pbVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  undefined1 auVar5 [16];
  byte local_241;
  undefined1 local_228 [8];
  upstream_settings upstream_settings;
  Config *local_150;
  Config *upstream_config;
  basic_string_view<char,_std::char_traits<char>_> upstream_name;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  undefined1 local_110 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  upstream_names;
  char *local_f0;
  size_t local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  string_view upstreams_list;
  RenX_RelayPlugin *this_local;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_init_time).__d.__r = rVar2;
  get_settings((upstream_settings *)&upstreams_list._M_str,this,(Config *)&this->field_0x38);
  RenX_RelayPlugin::upstream_settings::operator=
            (&this->m_default_settings,(upstream_settings *)&upstreams_list._M_str);
  RenX_RelayPlugin::upstream_settings::~upstream_settings
            ((upstream_settings *)&upstreams_list._M_str);
  bVar4 = sv("Upstreams",9);
  join_0x00000010_0x00000000_ = sv("",0);
  local_e8 = bVar4._M_len;
  local_e0 = bVar4._M_str;
  auVar5 = Jupiter::Config::get
                     (&this->field_0x38,local_e8,local_e0,
                      upstream_names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f0);
  upstreams_list._M_len = auVar5._8_8_;
  local_d8 = auVar5._0_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range1," \t");
  jessilib::
  word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_110,
             (basic_string_view<char,_std::char_traits<char>_> *)local_d8,
             (basic_string_view<char,_std::char_traits<char>_> *)&__range1);
  __end1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_110);
  upstream_name._M_str =
       (char *)std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_110);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      (&__end1,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&upstream_name._M_str);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end1);
    upstream_config = (Config *)pbVar3->_M_len;
    upstream_name._M_len = (size_t)pbVar3->_M_str;
    local_150 = (Config *)
                Jupiter::Config::getSection(&this->field_0x38,upstream_config,upstream_name._M_len);
    if (local_150 == (Config *)0x0) {
      local_150 = (Config *)&this->field_0x38;
    }
    get_settings((upstream_settings *)local_228,this,local_150);
    std::__cxx11::string::operator=
              ((string *)local_228,
               (basic_string_view<char,_std::char_traits<char>_> *)&upstream_config);
    std::
    vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
    ::push_back(&this->m_configured_upstreams,(value_type *)local_228);
    RenX_RelayPlugin::upstream_settings::~upstream_settings((upstream_settings *)local_228);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::
          vector<RenX_RelayPlugin::upstream_settings,_std::allocator<RenX_RelayPlugin::upstream_settings>_>
          ::empty(&this->m_configured_upstreams);
  local_241 = 0;
  if (!bVar1) {
    local_241 = Jupiter::Plugin::initialize();
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_110);
  return (bool)(local_241 & 1);
}

Assistant:

bool RenX_RelayPlugin::initialize() {
	m_init_time = std::chrono::steady_clock::now();
	// TODO: add BindHost, BindPort
	// TODO: invent a way to send a custom hostname directly to the devbot, rather than having to rely on manual configuration
	// TODO: Add bidirectional relay support (i.e: bot link)
	// TODO: Add game data relay support (so players connect through this)
	// 			* Drop packets for non-players when traffic spikes
	//			* notify game server to set failover

	m_default_settings = get_settings(config);

	std::string_view upstreams_list = config.get("Upstreams"sv, ""sv);
	std::vector<std::string_view> upstream_names = jessilib::word_split_view(upstreams_list, WHITESPACE_SV);
	for (auto upstream_name : upstream_names) {
		auto upstream_config = config.getSection(upstream_name);
		if (upstream_config == nullptr) {
			upstream_config = &config;
		}

		auto upstream_settings = get_settings(*upstream_config);
		upstream_settings.m_label = upstream_name;
		m_configured_upstreams.push_back(std::move(upstream_settings));
	}

	return !m_configured_upstreams.empty() && RenX::Plugin::initialize();
}